

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Point2f pbrt::EqualAreaSphereToSquare(Vector3f *d)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar9 [16];
  
  uVar2._0_4_ = (d->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar2._4_4_ = (d->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar2;
  auVar9._0_4_ = (float)(undefined4)uVar2 * (float)(undefined4)uVar2;
  auVar9._4_4_ = (float)uVar2._4_4_ * (float)uVar2._4_4_;
  auVar9._8_8_ = 0;
  auVar9 = vmovshdup_avx(auVar9);
  fVar1 = (d->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar9 = vfmadd231ss_fma(auVar9,auVar11,auVar11);
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
  if ((0.999 < auVar9._0_4_) && (auVar9._0_4_ < 1.001)) {
    auVar13._8_4_ = 0x7fffffff;
    auVar13._0_8_ = 0x7fffffff7fffffff;
    auVar13._12_4_ = 0x7fffffff;
    uVar7 = 0xff;
    if (0.0 <= fVar1) {
      uVar7 = 0;
    }
    auVar9 = vandps_avx(auVar11,auVar13);
    auVar13 = vandps_avx(ZEXT416((uint)fVar1),auVar13);
    auVar10 = vshufps_avx(auVar9,auVar9,0xf5);
    auVar3 = vmaxss_avx(auVar10,auVar9);
    auVar4 = vminss_avx(auVar10,auVar9);
    uVar5 = vcmpss_avx512f(auVar3,ZEXT816(0) << 0x40,0);
    auVar13 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar13._0_4_)),ZEXT816(0) << 0x40);
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    auVar8._4_12_ = auVar4._4_12_;
    auVar8._0_4_ = (uint)!(bool)((byte)uVar5 & 1) * (int)(auVar4._0_4_ / auVar3._0_4_);
    auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbccdf082),0),auVar8,ZEXT416(0x3d2ba368));
    uVar5 = vcmpss_avx512f(auVar9,auVar10,1);
    bVar6 = (bool)((byte)uVar5 & 1);
    auVar9 = vfmadd213ss_fma(auVar3,auVar8,ZEXT416(0x3db4962e));
    auVar9 = vfmadd213ss_fma(auVar9,auVar8,ZEXT416(0xbe7d450e));
    auVar9 = vfmadd213ss_fma(auVar9,auVar8,ZEXT416(0x3bc9c25a));
    auVar9 = vfmadd213ss_fma(auVar9,auVar8,ZEXT416(0x3f22dfbe));
    auVar9 = vfmadd213ss_fma(auVar9,auVar8,ZEXT416(0x36887c4b));
    auVar14._8_4_ = 0x3f800000;
    auVar14._0_8_ = 0x3f8000003f800000;
    auVar14._12_4_ = 0x3f800000;
    fVar1 = auVar13._0_4_ *
            (float)((uint)bVar6 * (int)(1.0 - auVar9._0_4_) + (uint)!bVar6 * (int)auVar9._0_4_);
    auVar9 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)(auVar13._0_4_ - fVar1)),0x10);
    auVar13 = vshufps_avx(auVar9,auVar9,0xe1);
    auVar9 = vsubps_avx512vl(auVar14,auVar9);
    bVar6 = (bool)((byte)uVar7 & 1);
    auVar10._0_4_ = (uint)bVar6 * auVar9._0_4_ | (uint)!bVar6 * auVar13._0_4_;
    bVar6 = (bool)((byte)(uVar7 >> 1) & 1);
    auVar10._4_4_ = (uint)bVar6 * auVar9._4_4_ | (uint)!bVar6 * auVar13._4_4_;
    bVar6 = (bool)((byte)(uVar7 >> 2) & 1);
    auVar10._8_4_ = (uint)bVar6 * auVar9._8_4_ | (uint)!bVar6 * auVar13._8_4_;
    bVar6 = (bool)((byte)(uVar7 >> 3) & 1);
    auVar10._12_4_ = (uint)bVar6 * auVar9._12_4_ | (uint)!bVar6 * auVar13._12_4_;
    auVar3._8_4_ = 0x80000000;
    auVar3._0_8_ = 0x8000000080000000;
    auVar3._12_4_ = 0x80000000;
    auVar9 = vpternlogd_avx512vl(auVar10,auVar11,auVar3,0x78);
    auVar12._0_4_ = auVar9._0_4_ + 1.0;
    auVar12._4_4_ = auVar9._4_4_ + 1.0;
    auVar12._8_4_ = auVar9._8_4_ + 1.0;
    auVar12._12_4_ = auVar9._12_4_ + 1.0;
    auVar4._8_4_ = 0x3f000000;
    auVar4._0_8_ = 0x3f0000003f000000;
    auVar4._12_4_ = 0x3f000000;
    auVar9 = vmulps_avx512vl(auVar12,auVar4);
    return (Point2f)auVar9._0_8_;
  }
  LogFatal<char_const(&)[52]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math.cpp"
             ,0x16f,"Check failed: %s",
             (char (*) [52])"LengthSquared(d) > .999 && LengthSquared(d) < 1.001");
}

Assistant:

PBRT_CPU_GPU inline T LengthSquared(const Vector3<T> &v) {
    return v.x * v.x + v.y * v.y + v.z * v.z;
}